

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

BCPos debug_framepc(lua_State *L,GCfunc *fn,cTValue *nextframe)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  cTValue *pcVar4;
  
  uVar1 = 0xffffffff;
  if ((fn->c).ffid == '\0') {
    if (nextframe == (cTValue *)0x0) {
      uVar2 = (ulong)L->cframe & 0xfffffffffffffffc;
      if (uVar2 == 0) {
        return 0xffffffff;
      }
      uVar1 = *(uint *)(uVar2 + 0x1c);
      if (uVar1 == *(uint *)(uVar2 + 0x18)) {
        return 0xffffffff;
      }
    }
    else {
      uVar1 = (nextframe->field_2).it;
      if ((uVar1 & 3) != 0) {
        if ((uVar1 & 7) != 2) {
          pcVar4 = L->base;
          uVar2 = (ulong)L->cframe & 0xfffffffffffffffc;
LAB_0010bb16:
          pcVar4 = pcVar4 + -1;
          do {
            while( true ) {
              if (uVar2 == 0) {
                return 0xffffffff;
              }
              if ((-1 < *(int *)(uVar2 + 0x10)) ||
                 ((cTValue *)((ulong)(uint)-*(int *)(uVar2 + 0x10) + (ulong)(L->stack).ptr32) <=
                  pcVar4)) break;
              uVar2 = *(ulong *)(uVar2 + 0x30) & 0xfffffffffffffffc;
            }
            if (pcVar4 < nextframe) {
              uVar1 = *(uint *)(uVar2 + 0x1c);
              if (uVar1 == 0) {
                return 0xffffffff;
              }
              goto LAB_0010badb;
            }
            uVar1 = (pcVar4->field_2).it;
            if ((uVar1 & 3) == 1) {
LAB_0010bb75:
              uVar2 = *(ulong *)(uVar2 + 0x30) & 0xfffffffffffffffc;
            }
            else {
              if ((uVar1 & 3) == 0) goto LAB_0010bb89;
              if (((uVar1 & 7) == 2) && (pcVar4[-1].u32.lo == 1)) goto LAB_0010bb75;
            }
            pcVar4 = (cTValue *)((long)pcVar4 - (long)(int)(uVar1 & 0xfffffff8));
          } while( true );
        }
        uVar1 = *(uint *)((long)nextframe + -4);
      }
    }
LAB_0010badb:
    uVar3 = (ulong)uVar1;
    uVar2 = (ulong)(fn->c).pc.ptr32;
    uVar1 = (int)(uVar3 - uVar2 >> 2) - 1;
    if ((*(uint *)(uVar2 - 0x38) < uVar1) &&
       (uVar1 = 0xffffffff, 0xfffffffb < *(byte *)(uVar3 - 4) - 0x4d)) {
      return (BCPos)(*(uint *)(uVar3 - 8) - uVar2 >> 2);
    }
  }
  return uVar1;
LAB_0010bb89:
  pcVar4 = pcVar4 + -(ulong)*(byte *)((ulong)uVar1 - 3);
  goto LAB_0010bb16;
}

Assistant:

static BCPos debug_framepc(lua_State *L, GCfunc *fn, cTValue *nextframe)
{
  const BCIns *ins;
  GCproto *pt;
  BCPos pos;
  lj_assertL(fn->c.gct == ~LJ_TFUNC || fn->c.gct == ~LJ_TTHREAD,
	     "function or frame expected");
  if (!isluafunc(fn)) {  /* Cannot derive a PC for non-Lua functions. */
    return NO_BCPOS;
  } else if (nextframe == NULL) {  /* Lua function on top. */
    void *cf = cframe_raw(L->cframe);
    if (cf == NULL || (char *)cframe_pc(cf) == (char *)cframe_L(cf))
      return NO_BCPOS;
    ins = cframe_pc(cf);  /* Only happens during error/hook handling. */
  } else {
    if (frame_islua(nextframe)) {
      ins = frame_pc(nextframe);
    } else if (frame_iscont(nextframe)) {
      ins = frame_contpc(nextframe);
    } else {
      /* Lua function below errfunc/gc/hook: find cframe to get the PC. */
      void *cf = cframe_raw(L->cframe);
      TValue *f = L->base-1;
      for (;;) {
	if (cf == NULL)
	  return NO_BCPOS;
	while (cframe_nres(cf) < 0) {
	  if (f >= restorestack(L, -cframe_nres(cf)))
	    break;
	  cf = cframe_raw(cframe_prev(cf));
	  if (cf == NULL)
	    return NO_BCPOS;
	}
	if (f < nextframe)
	  break;
	if (frame_islua(f)) {
	  f = frame_prevl(f);
	} else {
	  if (frame_isc(f) || (frame_iscont(f) && frame_iscont_fficb(f)))
	    cf = cframe_raw(cframe_prev(cf));
	  f = frame_prevd(f);
	}
      }
      ins = cframe_pc(cf);
      if (!ins) return NO_BCPOS;
    }
  }
  pt = funcproto(fn);
  pos = proto_bcpos(pt, ins) - 1;
#if LJ_HASJIT
  if (pos > pt->sizebc) {  /* Undo the effects of lj_trace_exit for JLOOP. */
    if (bc_isret(bc_op(ins[-1]))) {
      GCtrace *T = (GCtrace *)((char *)(ins-1) - offsetof(GCtrace, startins));
      pos = proto_bcpos(pt, mref(T->startpc, const BCIns));
    } else {
      pos = NO_BCPOS;  /* Punt in case of stack overflow for stitched trace. */
    }
  }
#endif
  return pos;
}